

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

bool __thiscall
deqp::UniformBlockCase::checkLayoutBounds(UniformBlockCase *this,UniformLayout *layout)

{
  uint uVar1;
  int iVar2;
  ostringstream *this_00;
  int iVar3;
  DataType DVar4;
  TestLog *pTVar5;
  pointer pUVar6;
  pointer pBVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 local_1b0 [384];
  
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar11 = (ulong)((long)(layout->uniforms).
                         super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(layout->uniforms).
                        super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  uVar18 = 0;
  uVar12 = uVar11 & 0xffffffff;
  if ((int)uVar11 < 1) {
    uVar12 = uVar18;
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar8 = true;
  do {
    if (uVar12 << 6 == uVar18) {
      return bVar8;
    }
    pUVar6 = (layout->uniforms).
             super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = (long)*(int *)((long)&pUVar6->blockNdx + uVar18);
    if (-1 < lVar17) {
      pBVar7 = (layout->blocks).
               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      DVar4 = *(DataType *)((long)&pUVar6->type + uVar18);
      if (DVar4 - TYPE_FLOAT_MAT2 < 9 || DVar4 - TYPE_DOUBLE_MAT2 < 9) {
        if ((&pUVar6->isRowMajor)[uVar18] == true) {
          iVar9 = glu::getDataTypeMatrixNumRows(DVar4);
        }
        else {
          iVar9 = glu::getDataTypeMatrixNumColumns(DVar4);
        }
        DVar4 = *(DataType *)((long)&pUVar6->type + uVar18);
        if ((&pUVar6->isRowMajor)[uVar18] == true) {
          iVar10 = glu::getDataTypeMatrixNumColumns(DVar4);
        }
        else {
          iVar10 = glu::getDataTypeMatrixNumRows(DVar4);
        }
      }
      else {
        iVar10 = glu::getDataTypeScalarSize(DVar4);
        iVar9 = 1;
      }
      uVar16 = (iVar9 + -1) * *(int *)((long)&pUVar6->matrixStride + uVar18);
      iVar9 = *(int *)((long)&pUVar6->offset + uVar18);
      uVar13 = (*(int *)((long)&pUVar6->size + uVar18) + -1) *
               *(int *)((long)&pUVar6->arrayStride + uVar18);
      uVar14 = uVar13;
      if ((int)uVar16 < (int)uVar13) {
        uVar14 = uVar16;
      }
      uVar1 = uVar13 + uVar16;
      if ((int)uVar1 <= (int)uVar14) {
        uVar14 = uVar1;
      }
      if (-1 < (int)(((int)uVar14 >> 0x1f & uVar14) + iVar9)) {
        iVar2 = uVar1 + iVar10 * 4;
        iVar3 = uVar16 + iVar10 * 4;
        iVar15 = iVar10 * 4;
        if (iVar10 * 4 <= iVar3) {
          iVar15 = iVar3;
        }
        iVar10 = uVar13 + iVar10 * 4;
        if (iVar15 <= iVar10) {
          iVar15 = iVar10;
        }
        if (iVar15 <= iVar2) {
          iVar15 = iVar2;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        if (iVar15 + iVar9 <= pBVar7[lVar17].size) goto LAB_00d9a612;
      }
      local_1b0._0_8_ = pTVar5;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Error: Uniform \'");
      std::operator<<((ostream *)this_00,(string *)((long)&(pUVar6->name)._M_dataplus._M_p + uVar18)
                     );
      std::operator<<((ostream *)this_00,"\' out of block bounds");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      bVar8 = false;
    }
LAB_00d9a612:
    uVar18 = uVar18 + 0x40;
  } while( true );
}

Assistant:

bool UniformBlockCase::checkLayoutBounds(const UniformLayout& layout) const
{
	TestLog& log		 = m_testCtx.getLog();
	int		 numUniforms = (int)layout.uniforms.size();
	bool	 isOk		 = true;

	for (int uniformNdx = 0; uniformNdx < numUniforms; uniformNdx++)
	{
		const UniformLayoutEntry& uniform = layout.uniforms[uniformNdx];

		if (uniform.blockNdx < 0)
			continue;

		const BlockLayoutEntry& block	= layout.blocks[uniform.blockNdx];
		bool					isMatrix = glu::isDataTypeMatrix(uniform.type);
		int						numVecs = isMatrix ? (uniform.isRowMajor ? glu::getDataTypeMatrixNumRows(uniform.type) :
													   glu::getDataTypeMatrixNumColumns(uniform.type)) :
								 1;
		int numComps = isMatrix ? (uniform.isRowMajor ? glu::getDataTypeMatrixNumColumns(uniform.type) :
														glu::getDataTypeMatrixNumRows(uniform.type)) :
								  glu::getDataTypeScalarSize(uniform.type);
		int		  numElements = uniform.size;
		const int compSize	= sizeof(deUint32);
		int		  vecSize	 = numComps * compSize;

		int minOffset = 0;
		int maxOffset = 0;

		// For negative strides.
		minOffset = de::min(minOffset, (numVecs - 1) * uniform.matrixStride);
		minOffset = de::min(minOffset, (numElements - 1) * uniform.arrayStride);
		minOffset = de::min(minOffset, (numElements - 1) * uniform.arrayStride + (numVecs - 1) * uniform.matrixStride);

		maxOffset = de::max(maxOffset, vecSize);
		maxOffset = de::max(maxOffset, (numVecs - 1) * uniform.matrixStride + vecSize);
		maxOffset = de::max(maxOffset, (numElements - 1) * uniform.arrayStride + vecSize);
		maxOffset = de::max(maxOffset,
							(numElements - 1) * uniform.arrayStride + (numVecs - 1) * uniform.matrixStride + vecSize);

		if (uniform.offset + minOffset < 0 || uniform.offset + maxOffset > block.size)
		{
			log << TestLog::Message << "Error: Uniform '" << uniform.name << "' out of block bounds"
				<< TestLog::EndMessage;
			isOk = false;
		}
	}

	return isOk;
}